

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# algorithms.h
# Opt level: O1

basic_string<char> * __thiscall
frozen::bits::LowerBound<frozen::basic_string<char>,std::less<frozen::basic_string<char>>>::
doitfirst<frozen::basic_string<char>const*,32ul>
          (LowerBound<frozen::basic_string<char>,std::less<frozen::basic_string<char>>> *this,
          long first)

{
  long lVar1;
  long lVar2;
  long *plVar3;
  char cVar4;
  long *plVar5;
  ulong uVar6;
  ulong uVar7;
  basic_string<char> *it;
  basic_string<char> *pbVar8;
  ulong uVar9;
  ulong uVar10;
  uint uVar11;
  ulong uVar12;
  ulong uVar13;
  bool bVar14;
  
  plVar5 = *(long **)this;
  uVar6 = *(ulong *)(first + 0xf8);
  uVar7 = plVar5[1];
  uVar10 = uVar7;
  if (uVar6 < uVar7) {
    uVar10 = uVar6;
  }
  if (uVar10 != 0) {
    uVar9 = 0;
    uVar13 = 1;
    do {
      cVar4 = *(char *)(*(long *)(first + 0xf0) + uVar9);
      if (cVar4 != *(char *)(*plVar5 + uVar9)) {
        bVar14 = cVar4 < *(char *)(*plVar5 + uVar9);
        goto LAB_00188e29;
      }
      bVar14 = uVar13 < uVar10;
      uVar9 = uVar13;
      uVar13 = (ulong)((int)uVar13 + 1);
    } while (bVar14);
  }
  bVar14 = uVar6 < uVar7;
LAB_00188e29:
  if (bVar14) {
    pbVar8 = doitfirst<frozen::basic_string<char>const*,16ul>(this,first + 0x100);
    return pbVar8;
  }
  uVar6 = *(ulong *)(first + 0x78);
  uVar10 = uVar7;
  if (uVar6 < uVar7) {
    uVar10 = uVar6;
  }
  if (uVar10 != 0) {
    uVar9 = 1;
    uVar13 = 0;
    do {
      uVar12 = uVar9;
      cVar4 = *(char *)(*(long *)(first + 0x70) + uVar13);
      if (cVar4 != *(char *)(*plVar5 + uVar13)) {
        bVar14 = cVar4 < *(char *)(*plVar5 + uVar13);
        goto LAB_00188e7e;
      }
      uVar9 = (ulong)((int)uVar12 + 1);
      uVar13 = uVar12;
    } while (uVar12 < uVar10);
  }
  bVar14 = uVar6 < uVar7;
LAB_00188e7e:
  lVar1 = first + (ulong)bVar14 * 0x80;
  uVar6 = *(ulong *)(first + 0x38 + (ulong)bVar14 * 0x80);
  uVar10 = uVar7;
  if (uVar6 < uVar7) {
    uVar10 = uVar6;
  }
  if (uVar10 != 0) {
    uVar9 = 1;
    uVar13 = 0;
    do {
      uVar12 = uVar9;
      cVar4 = *(char *)(*(long *)(lVar1 + 0x30) + uVar13);
      if (cVar4 != *(char *)(*plVar5 + uVar13)) {
        bVar14 = cVar4 < *(char *)(*plVar5 + uVar13);
        goto LAB_00188ece;
      }
      uVar9 = (ulong)((int)uVar12 + 1);
      uVar13 = uVar12;
    } while (uVar12 < uVar10);
  }
  bVar14 = uVar6 < uVar7;
LAB_00188ece:
  lVar2 = lVar1 + (ulong)bVar14 * 0x40;
  uVar6 = *(ulong *)(lVar1 + 0x18 + (ulong)bVar14 * 0x40);
  uVar10 = uVar7;
  if (uVar6 < uVar7) {
    uVar10 = uVar6;
  }
  if (uVar10 != 0) {
    uVar9 = 1;
    uVar13 = 0;
    do {
      uVar12 = uVar9;
      cVar4 = *(char *)(*(long *)(lVar2 + 0x10) + uVar13);
      if (cVar4 != *(char *)(*plVar5 + uVar13)) {
        bVar14 = cVar4 < *(char *)(*plVar5 + uVar13);
        goto LAB_00188f1d;
      }
      uVar9 = (ulong)((int)uVar12 + 1);
      uVar13 = uVar12;
    } while (uVar12 < uVar10);
  }
  bVar14 = uVar6 < uVar7;
LAB_00188f1d:
  plVar3 = (long *)(lVar2 + (ulong)bVar14 * 0x20);
  uVar6 = *(ulong *)(lVar2 + 8 + (ulong)bVar14 * 0x20);
  uVar10 = uVar7;
  if (uVar6 < uVar7) {
    uVar10 = uVar6;
  }
  if (uVar10 != 0) {
    uVar11 = 1;
    uVar9 = 0;
    do {
      cVar4 = *(char *)(*plVar3 + uVar9);
      if (cVar4 != *(char *)(*plVar5 + uVar9)) {
        bVar14 = cVar4 < *(char *)(*plVar5 + uVar9);
        goto LAB_00188f6a;
      }
      uVar9 = (ulong)uVar11;
      uVar11 = uVar11 + 1;
    } while (uVar9 < uVar10);
  }
  bVar14 = uVar6 < uVar7;
LAB_00188f6a:
  return (basic_string<char> *)(plVar3 + (ulong)bVar14 * 2);
}

Assistant:

inline constexpr ForwardIt doitfirst(ForwardIt first, std::integral_constant<std::size_t, N>, std::integral_constant<bool, false>) {
    auto constexpr next_power = next_highest_power_of_two(N);
    auto constexpr next_start = next_power / 2 - 1;
    auto it = first + next_start;
    if (compare_(*it, value_)) {
      auto constexpr next = N - next_start - 1;
      return doitfirst(it + 1, std::integral_constant<std::size_t, next>{}, std::integral_constant<bool, next_highest_power_of_two(next) - 1 == next>{});
    }
    else
      return doit_fast(first, std::integral_constant<std::size_t, next_start>{});
  }